

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroup.hpp
# Opt level: O1

void __thiscall OpenMD::CutoffGroup::addAtom(CutoffGroup *this,Atom *atom)

{
  pointer *pppAVar1;
  iterator __position;
  Atom *local_8;
  
  __position._M_current =
       (this->cutoffAtomList).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->cutoffAtomList).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = atom;
    std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>::_M_realloc_insert<OpenMD::Atom*const&>
              ((vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>> *)this,__position,&local_8);
  }
  else {
    *__position._M_current = atom;
    pppAVar1 = &(this->cutoffAtomList).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  return;
}

Assistant:

void addAtom(Atom* atom) { cutoffAtomList.push_back(atom); }